

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O0

void crnlib::utils::endian_swap_mem(void *p,uint size_in_bytes,uint type_size)

{
  uint type_size_local;
  uint size_in_bytes_local;
  void *p_local;
  
  if (type_size == 2) {
    endian_swap_mem16((uint16 *)p,size_in_bytes / 2);
  }
  else if (type_size == 4) {
    endian_swap_mem32((uint32 *)p,size_in_bytes / 4);
  }
  else if (type_size == 8) {
    endian_swap_mem64((uint64 *)p,size_in_bytes / 8);
  }
  return;
}

Assistant:

inline void endian_swap_mem(void* p, uint size_in_bytes, uint type_size) {
            switch (type_size)
            {
            case sizeof(uint16) :
                endian_swap_mem16(static_cast<uint16*>(p), size_in_bytes / type_size);
                break;
            case sizeof(uint32) :
                endian_swap_mem32(static_cast<uint32*>(p), size_in_bytes / type_size);
                break;
            case sizeof(uint64) :
                endian_swap_mem64(static_cast<uint64*>(p), size_in_bytes / type_size);
                break;
            }
        }